

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestTheAbilityOfTheCollectionToGrowItsCapacity_Test::TestBody
          (ExtendedDataDictionaryTest_TestTheAbilityOfTheCollectionToGrowItsCapacity_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  uint uVar5;
  ulong uVar6;
  pointer pcVar7;
  char *pcVar8;
  uint __val;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  ExtendableDataDictionary data_dictionary;
  AssertHelper local_158;
  AssertHelper local_150;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  long local_138 [2];
  internal local_128 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  code *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  FieldDef local_c8 [8];
  long *local_c0;
  long local_b0 [3];
  code *local_98;
  _Rb_tree<int,_std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
  _Stack_60;
  
  local_98 = bidfx_public_api::tools::ByteBuffer::WriteShort;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl._0_8_ = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_60._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_60._M_impl._0_8_ = 0;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148.ptr_ = local_148.ptr_ & 0xffffffff00000000;
  local_f0 = bidfx_public_api::tools::ByteBuffer::WriteShort;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_158.data_._0_4_ = bidfx_public_api::price::pixie::ExtendableDataDictionary::size();
  testing::internal::CmpHelperEQ<int,int>
            (local_128,"0","data_dictionary.size()",(int *)&local_148,(int *)&local_158);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if (local_120[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_120[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0xcc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (((local_148.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_148.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_148.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_148.ptr_ = local_148.ptr_ & 0xffffffff00000000;
    local_158.data_._0_4_ = bidfx_public_api::price::pixie::ExtendableDataDictionary::NextFreeFid();
    testing::internal::CmpHelperEQ<int,int>
              (local_128,"0","data_dictionary.NextFreeFid()",(int *)&local_148,(int *)&local_158);
    if (local_128[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_148);
      if (local_120[0].ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_120[0].ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                 ,0xcd,pcVar7);
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      if (((local_148.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_148.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_148.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar6 = 1;
      do {
        __val = (int)uVar6 - 1;
        uVar5 = 3 - (__val < 100);
        if (__val < 10) {
          uVar5 = 1;
        }
        local_148.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
        local_110.field_2._8_8_ = uVar6;
        std::__cxx11::string::_M_construct((ulong)&local_148,(char)uVar5);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_148.ptr_,uVar5,__val);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x213d22);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_d8 = *plVar4;
          uStack_d0 = (undefined4)plVar3[3];
          uStack_cc = *(undefined4 *)((long)plVar3 + 0x1c);
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar4;
          local_e8 = (long *)*plVar3;
        }
        local_e0 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        bidfx_public_api::price::pixie::FieldDef::FieldDef
                  ((FieldDef *)local_128,__val,0x53,&local_e8,0x31,1);
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_148.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138) {
          operator_delete(local_148.ptr_,local_138[0] + 1);
        }
        bidfx_public_api::price::pixie::FieldDef::FieldDef(local_c8,(FieldDef *)local_128);
        bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(&local_98,local_c8);
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
        local_158.data_._0_4_ = (undefined4)local_110.field_2._8_8_;
        local_150.data_._0_4_ = bidfx_public_api::price::pixie::ExtendableDataDictionary::size();
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_148,"i + 1","data_dictionary.size()",(int *)&local_158,
                   (int *)&local_150);
        if (local_148.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_158);
          if (local_140.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((local_140.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                     ,0xd4,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          if (((CONCAT44(local_158.data_._4_4_,local_158.data_._0_4_) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(local_158.data_._4_4_,local_158.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_158.data_._4_4_,local_158.data_._0_4_) + 8))();
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_140,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001786da:
          if (local_120[0].ptr_ != &local_110) {
            operator_delete(local_120[0].ptr_,(ulong)(local_110._M_dataplus._M_p + 1));
          }
          break;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_158.data_._0_4_ = (undefined4)local_110.field_2._8_8_;
        local_150.data_._0_4_ =
             bidfx_public_api::price::pixie::ExtendableDataDictionary::NextFreeFid();
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_148,"i + 1","data_dictionary.NextFreeFid()",(int *)&local_158,
                   (int *)&local_150);
        if (local_148.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_158);
          if (local_140.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((local_140.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                     ,0xd5,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          if (((CONCAT44(local_158.data_._4_4_,local_158.data_._0_4_) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(local_158.data_._4_4_,local_158.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_158.data_._4_4_,local_158.data_._0_4_) + 8))();
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_140,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          goto LAB_001786da;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        uVar1 = local_110.field_2._8_8_;
        if (local_120[0].ptr_ != &local_110) {
          operator_delete(local_120[0].ptr_,(ulong)(local_110._M_dataplus._M_p + 1));
        }
        uVar5 = (int)uVar1 + 1;
        uVar6 = (ulong)uVar5;
      } while (uVar5 != 0x3e9);
    }
  }
  local_98 = local_f0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
  ::~_Rb_tree(&_Stack_60);
  std::
  _Rb_tree<int,_std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

ExtendableDataDictionary CreateExtendableDataDictionary()
{
    ExtendableDataDictionary result = ExtendableDataDictionary();
    result.AddFieldDef(bid2);
    result.AddFieldDef(ask2);
    result.AddFieldDef(bid_size2);
    result.AddFieldDef(ask_size2);
    result.AddFieldDef(status2);
    return result;
}